

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cram_io.c
# Opt level: O0

int cram_compress_block(cram_fd *fd,cram_block *b,cram_metrics *metrics,int method,int level)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  FILE *__stream;
  int iVar4;
  char *pcVar5;
  double dVar6;
  int local_104;
  double r_5;
  double r_4;
  double r_3;
  double r_2;
  double r_1;
  double r;
  int best_sz;
  int best_method;
  char *c;
  char *c_best;
  ulong uStack_80;
  int method_best;
  size_t sz_lzma;
  size_t sz_bzip2;
  size_t sz_rans1;
  size_t sz_rans0;
  size_t sz_gz_def;
  size_t sz_gz_rle;
  size_t sz_best;
  size_t sStack_40;
  int strat;
  size_t comp_size;
  char *comp;
  int level_local;
  int method_local;
  cram_metrics *metrics_local;
  cram_block *b_local;
  cram_fd *fd_local;
  
  comp_size = 0;
  sStack_40 = 0;
  if (((method == 0) || (level == 0)) || (b->uncomp_size == 0)) {
    b->method = RAW;
    b->comp_size = b->uncomp_size;
  }
  else {
    comp._0_4_ = level;
    comp._4_4_ = method;
    _level_local = metrics;
    metrics_local = (cram_metrics *)b;
    b_local = (cram_block *)fd;
    if (metrics == (cram_metrics *)0x0) {
      comp_size = (size_t)cram_compress_by_method
                                    ((char *)b->data,(long)b->uncomp_size,&stack0xffffffffffffffc0,
                                     GZIP,level,1);
      if ((char *)comp_size == (char *)0x0) {
        fprintf(_stderr,"Compression failed!\n");
        return -1;
      }
      free(*(void **)&metrics_local->method);
      metrics_local->method = (undefined4)comp_size;
      metrics_local->strat = comp_size._4_4_;
      metrics_local->sz_rans0 = (int)sStack_40;
      metrics_local->trial = 1;
    }
    else {
      pthread_mutex_lock((pthread_mutex_t *)&fd->metrics_lock);
      if ((_level_local->trial < 1) &&
         (iVar4 = _level_local->next_trial + -1, _level_local->next_trial = iVar4, 0 < iVar4)) {
        sz_best._4_4_ = _level_local->strat;
        comp._4_4_ = _level_local->method;
        pthread_mutex_unlock((pthread_mutex_t *)&b_local[0x221].byte);
        comp_size = (size_t)cram_compress_by_method
                                      (*(char **)&metrics_local->method,
                                       (long)metrics_local->sz_rans1,&stack0xffffffffffffffc0,
                                       comp._4_4_,(int)comp,sz_best._4_4_);
        if ((char *)comp_size == (char *)0x0) {
          return -1;
        }
        free(*(void **)&metrics_local->method);
        metrics_local->method = (undefined4)comp_size;
        metrics_local->strat = comp_size._4_4_;
        metrics_local->sz_rans0 = (int)sStack_40;
        metrics_local->trial = comp._4_4_;
      }
      else {
        sz_gz_rle = 0x7fffffff;
        sz_gz_def = 0;
        sz_rans0 = 0;
        sz_rans1 = 0;
        sz_bzip2 = 0;
        sz_lzma = 0;
        uStack_80 = 0;
        c_best._4_4_ = 0;
        c = (char *)0x0;
        if (_level_local->revised_method == 0) {
          _level_local->revised_method = comp._4_4_;
        }
        else {
          comp._4_4_ = _level_local->revised_method;
        }
        if (_level_local->next_trial == 0) {
          _level_local->next_trial = 0x32;
          _level_local->trial = 3;
          _level_local->sz_gz_rle = _level_local->sz_gz_rle / 2;
          _level_local->sz_gz_def = _level_local->sz_gz_def / 2;
          _level_local->sz_rans0 = _level_local->sz_rans0 / 2;
          _level_local->sz_rans1 = _level_local->sz_rans1 / 2;
          _level_local->sz_bzip2 = _level_local->sz_bzip2 / 2;
          _level_local->sz_lzma = _level_local->sz_lzma / 2;
        }
        pthread_mutex_unlock((pthread_mutex_t *)&b_local[0x221].byte);
        if ((comp._4_4_ & 0x800) != RAW) {
          pcVar5 = cram_compress_by_method
                             (*(char **)&metrics_local->method,(long)metrics_local->sz_rans1,
                              &sz_gz_def,GZIP,1,3);
          if ((pcVar5 == (char *)0x0) || (sz_gz_rle <= sz_gz_def)) {
            if (pcVar5 == (char *)0x0) {
              sz_gz_def = (size_t)(metrics_local->sz_rans1 * 2 + 1000);
            }
            else {
              free(pcVar5);
            }
          }
          else {
            c_best._4_4_ = 0xb;
            sz_gz_rle = sz_gz_def;
            c = pcVar5;
          }
        }
        pcVar5 = c;
        if ((comp._4_4_ & BZIP2) != RAW) {
          pcVar5 = cram_compress_by_method
                             (*(char **)&metrics_local->method,(long)metrics_local->sz_rans1,
                              &sz_rans0,GZIP,(int)comp,1);
          if ((pcVar5 == (char *)0x0) || (sz_gz_rle <= sz_rans0)) {
            if (pcVar5 == (char *)0x0) {
              sz_rans0 = (size_t)(metrics_local->sz_rans1 * 2 + 1000);
              pcVar5 = c;
            }
            else {
              free(pcVar5);
              pcVar5 = c;
            }
          }
          else {
            sz_gz_rle = sz_rans0;
            c_best._4_4_ = 1;
            if (c != (char *)0x0) {
              free(c);
            }
          }
        }
        c = pcVar5;
        pcVar5 = c;
        if ((comp._4_4_ & 0x10) != RAW) {
          pcVar5 = cram_compress_by_method
                             (*(char **)&metrics_local->method,(long)metrics_local->sz_rans1,
                              &sz_rans1,RANS,0,0);
          if ((pcVar5 == (char *)0x0) || (sz_gz_rle <= sz_rans1)) {
            if (pcVar5 == (char *)0x0) {
              sz_rans1 = (size_t)(metrics_local->sz_rans1 * 2 + 1000);
              pcVar5 = c;
            }
            else {
              free(pcVar5);
              pcVar5 = c;
            }
          }
          else {
            sz_gz_rle = sz_rans1;
            c_best._4_4_ = 4;
            if (c != (char *)0x0) {
              free(c);
            }
          }
        }
        c = pcVar5;
        pcVar5 = c;
        if ((comp._4_4_ & 0x400) != RAW) {
          pcVar5 = cram_compress_by_method
                             (*(char **)&metrics_local->method,(long)metrics_local->sz_rans1,
                              &sz_bzip2,RANS1,0,0);
          if ((pcVar5 == (char *)0x0) || (sz_gz_rle <= sz_bzip2)) {
            if (pcVar5 == (char *)0x0) {
              sz_bzip2 = (size_t)(metrics_local->sz_rans1 * 2 + 1000);
              pcVar5 = c;
            }
            else {
              free(pcVar5);
              pcVar5 = c;
            }
          }
          else {
            sz_gz_rle = sz_bzip2;
            c_best._4_4_ = 10;
            if (c != (char *)0x0) {
              free(c);
            }
          }
        }
        c = pcVar5;
        pcVar5 = c;
        if ((comp._4_4_ & RANS) != RAW) {
          pcVar5 = cram_compress_by_method
                             (*(char **)&metrics_local->method,(long)metrics_local->sz_rans1,
                              &sz_lzma,BZIP2,(int)comp,0);
          if ((pcVar5 == (char *)0x0) || (sz_gz_rle <= sz_lzma)) {
            if (pcVar5 == (char *)0x0) {
              sz_lzma = (size_t)(metrics_local->sz_rans1 * 2 + 1000);
              pcVar5 = c;
            }
            else {
              free(pcVar5);
              pcVar5 = c;
            }
          }
          else {
            sz_gz_rle = sz_lzma;
            c_best._4_4_ = 2;
            if (c != (char *)0x0) {
              free(c);
            }
          }
        }
        c = pcVar5;
        pcVar5 = c;
        if ((comp._4_4_ & 8) != RAW) {
          pcVar5 = cram_compress_by_method
                             (*(char **)&metrics_local->method,(long)metrics_local->sz_rans1,
                              &stack0xffffffffffffff80,LZMA,(int)comp,0);
          if ((pcVar5 == (char *)0x0) || (sz_gz_rle <= uStack_80)) {
            if (pcVar5 == (char *)0x0) {
              uStack_80 = (ulong)(metrics_local->sz_rans1 * 2 + 1000);
              pcVar5 = c;
            }
            else {
              free(pcVar5);
              pcVar5 = c;
            }
          }
          else {
            sz_gz_rle = uStack_80;
            c_best._4_4_ = 3;
            if (c != (char *)0x0) {
              free(c);
            }
          }
        }
        c = pcVar5;
        free(*(void **)&metrics_local->method);
        *(char **)&metrics_local->method = c;
        if (c_best._4_4_ == 0xb) {
          local_104 = 1;
        }
        else {
          local_104 = c_best._4_4_;
        }
        metrics_local->trial = local_104;
        metrics_local->sz_rans0 = (int)sz_gz_rle;
        pthread_mutex_lock((pthread_mutex_t *)&b_local[0x221].byte);
        _level_local->sz_gz_rle = _level_local->sz_gz_rle + (int)sz_gz_def;
        _level_local->sz_gz_def = _level_local->sz_gz_def + (int)sz_rans0;
        _level_local->sz_rans0 = _level_local->sz_rans0 + (int)sz_rans1;
        _level_local->sz_rans1 = _level_local->sz_rans1 + (int)sz_bzip2;
        _level_local->sz_bzip2 = _level_local->sz_bzip2 + (int)sz_lzma;
        _level_local->sz_lzma = _level_local->sz_lzma + (int)uStack_80;
        iVar4 = _level_local->trial + -1;
        _level_local->trial = iVar4;
        if (iVar4 == 0) {
          r._4_4_ = 0;
          r._0_4_ = 0x7fffffff;
          if (b_local[1].bit < 4) {
            _level_local->sz_rans1 = (int)((double)_level_local->sz_rans1 * 1.02);
            _level_local->sz_gz_def = (int)((double)_level_local->sz_gz_def * 1.04);
            _level_local->sz_bzip2 = (int)((double)_level_local->sz_bzip2 * 1.08);
            _level_local->sz_lzma = (int)((double)_level_local->sz_lzma * 1.1);
          }
          else if (b_local[1].bit < 7) {
            _level_local->sz_rans1 = (int)((double)_level_local->sz_rans1 * 1.01);
            _level_local->sz_gz_def = (int)((double)_level_local->sz_gz_def * 1.02);
            _level_local->sz_bzip2 = (int)((double)_level_local->sz_bzip2 * 1.03);
            _level_local->sz_lzma = (int)((double)_level_local->sz_lzma * 1.05);
          }
          if (((comp._4_4_ & 0x800) != RAW) && (_level_local->sz_gz_rle < 0x7fffffff)) {
            r._0_4_ = _level_local->sz_gz_rle;
            r._4_4_ = 0xb;
          }
          if (((comp._4_4_ & BZIP2) != RAW) && (_level_local->sz_gz_def < r._0_4_)) {
            r._0_4_ = _level_local->sz_gz_def;
            r._4_4_ = 1;
          }
          if (((comp._4_4_ & 0x10) != RAW) && (_level_local->sz_rans0 < r._0_4_)) {
            r._0_4_ = _level_local->sz_rans0;
            r._4_4_ = 4;
          }
          if (((comp._4_4_ & 0x400) != RAW) && (_level_local->sz_rans1 < r._0_4_)) {
            r._0_4_ = _level_local->sz_rans1;
            r._4_4_ = 10;
          }
          if (((comp._4_4_ & RANS) != RAW) && (_level_local->sz_bzip2 < r._0_4_)) {
            r._0_4_ = _level_local->sz_bzip2;
            r._4_4_ = 2;
          }
          if (((comp._4_4_ & 8) != RAW) && (_level_local->sz_lzma < r._0_4_)) {
            r._0_4_ = _level_local->sz_lzma;
            r._4_4_ = 3;
          }
          if (r._4_4_ == 0xb) {
            _level_local->method = 1;
            _level_local->strat = 3;
            _level_local->gz_rle_cnt = 0;
            _level_local->gz_rle_extra = 0.0;
          }
          else {
            _level_local->method = r._4_4_;
            _level_local->strat = 1;
            if (r._0_4_ < _level_local->sz_gz_rle) {
              iVar4 = _level_local->gz_rle_cnt + 1;
              _level_local->gz_rle_cnt = iVar4;
              if ((3 < iVar4) &&
                 (dVar6 = ((double)_level_local->sz_gz_rle / (double)r._0_4_ - 1.0) +
                          _level_local->gz_rle_extra, _level_local->gz_rle_extra = dVar6,
                 0.2 <= dVar6)) {
                comp._4_4_ = comp._4_4_ & 0xfffff7ff;
              }
            }
          }
          if (r._4_4_ == 1) {
            _level_local->gz_def_cnt = 0;
            _level_local->gz_def_extra = 0.0;
          }
          else if (r._0_4_ < _level_local->sz_gz_def) {
            iVar4 = _level_local->gz_def_cnt + 1;
            _level_local->gz_def_cnt = iVar4;
            if ((3 < iVar4) &&
               (dVar6 = ((double)_level_local->sz_gz_def / (double)r._0_4_ - 1.0) +
                        _level_local->gz_def_extra, _level_local->gz_def_extra = dVar6, 0.2 <= dVar6
               )) {
              comp._4_4_ = comp._4_4_ & ~BZIP2;
            }
          }
          if (r._4_4_ == 4) {
            _level_local->rans0_cnt = 0;
            _level_local->rans0_extra = 0.0;
          }
          else if (r._0_4_ < _level_local->sz_rans0) {
            iVar4 = _level_local->rans0_cnt + 1;
            _level_local->rans0_cnt = iVar4;
            if ((3 < iVar4) &&
               (dVar6 = ((double)_level_local->sz_rans0 / (double)r._0_4_ - 1.0) +
                        _level_local->rans0_extra, _level_local->rans0_extra = dVar6, 0.2 <= dVar6))
            {
              comp._4_4_ = comp._4_4_ & 0xffffffef;
            }
          }
          if (r._4_4_ == 10) {
            _level_local->rans1_cnt = 0;
            _level_local->rans1_extra = 0.0;
          }
          else if (r._0_4_ < _level_local->sz_rans1) {
            iVar4 = _level_local->rans1_cnt + 1;
            _level_local->rans1_cnt = iVar4;
            if ((3 < iVar4) &&
               (dVar6 = ((double)_level_local->sz_rans1 / (double)r._0_4_ - 1.0) +
                        _level_local->rans1_extra, _level_local->rans1_extra = dVar6, 0.2 <= dVar6))
            {
              comp._4_4_ = comp._4_4_ & 0xfffffbff;
            }
          }
          if (r._4_4_ == 2) {
            _level_local->bzip2_cnt = 0;
            _level_local->bzip2_extra = 0.0;
          }
          else if (r._0_4_ < _level_local->sz_bzip2) {
            iVar4 = _level_local->bzip2_cnt + 1;
            _level_local->bzip2_cnt = iVar4;
            if ((3 < iVar4) &&
               (dVar6 = ((double)_level_local->sz_bzip2 / (double)r._0_4_ - 1.0) +
                        _level_local->bzip2_extra, _level_local->bzip2_extra = dVar6, 0.2 <= dVar6))
            {
              comp._4_4_ = comp._4_4_ & ~RANS;
            }
          }
          if (r._4_4_ == 3) {
            _level_local->lzma_cnt = 0;
            _level_local->lzma_extra = 0.0;
          }
          else if (r._0_4_ < _level_local->sz_lzma) {
            iVar4 = _level_local->lzma_cnt + 1;
            _level_local->lzma_cnt = iVar4;
            if ((3 < iVar4) &&
               (dVar6 = ((double)_level_local->sz_lzma / (double)r._0_4_ - 1.0) +
                        _level_local->lzma_extra, _level_local->lzma_extra = dVar6, 0.2 <= dVar6)) {
              comp._4_4_ = comp._4_4_ & 0xfffffff7;
            }
          }
          _level_local->revised_method = comp._4_4_;
        }
        pthread_mutex_unlock((pthread_mutex_t *)&b_local[0x221].byte);
      }
    }
    __stream = _stderr;
    if (*(int *)&b_local[7].field_0x3c != 0) {
      uVar1 = metrics_local->sz_gz_def;
      uVar2 = metrics_local->sz_rans1;
      uVar3 = metrics_local->sz_rans0;
      pcVar5 = cram_block_method2str(metrics_local->trial);
      fprintf(__stream,"Compressed block ID %d from %d to %d by method %s\n",(ulong)uVar1,
              (ulong)uVar2,(ulong)uVar3,pcVar5);
    }
    if (metrics_local->trial == 10) {
      metrics_local->trial = 4;
    }
  }
  return 0;
}

Assistant:

int cram_compress_block(cram_fd *fd, cram_block *b, cram_metrics *metrics,
			int method, int level) {

    char *comp = NULL;
    size_t comp_size = 0;
    int strat;

    //fprintf(stderr, "IN: block %d, sz %d\n", b->content_id, b->uncomp_size);

    if (method == RAW || level == 0 || b->uncomp_size == 0) {
	b->method = RAW;
	b->comp_size = b->uncomp_size;
	//fprintf(stderr, "Skip block id %d\n", b->content_id);
	return 0;
    }

    if (metrics) {
	pthread_mutex_lock(&fd->metrics_lock);
	if (metrics->trial > 0 || --metrics->next_trial <= 0) {
	    size_t sz_best = INT_MAX;
	    size_t sz_gz_rle = 0;
	    size_t sz_gz_def = 0;
	    size_t sz_rans0 = 0;
	    size_t sz_rans1 = 0;
	    size_t sz_bzip2 = 0;
	    size_t sz_lzma = 0;
	    int method_best = 0;
	    char *c_best = NULL, *c = NULL;

	    if (metrics->revised_method)
		method = metrics->revised_method;
	    else
		metrics->revised_method = method;

	    if (metrics->next_trial == 0) {
		metrics->next_trial = TRIAL_SPAN;
		metrics->trial = NTRIALS;
		metrics->sz_gz_rle /= 2;
		metrics->sz_gz_def /= 2;
		metrics->sz_rans0  /= 2;
		metrics->sz_rans1  /= 2;
		metrics->sz_bzip2  /= 2;
		metrics->sz_lzma   /= 2;
	    }

	    pthread_mutex_unlock(&fd->metrics_lock);
	    
	    if (method & (1<<GZIP_RLE)) {
		c = cram_compress_by_method((char *)b->data, b->uncomp_size,
					    &sz_gz_rle, GZIP, 1, Z_RLE);
		if (c && sz_best > sz_gz_rle) {
		    sz_best = sz_gz_rle;
		    method_best = GZIP_RLE;
		    if (c_best)
			free(c_best);
		    c_best = c;
		} else if (c) {
		    free(c);
		} else {
		    sz_gz_rle = b->uncomp_size*2+1000;
		}

		//fprintf(stderr, "Block %d; %d->%d\n", b->content_id, b->uncomp_size, sz_gz_rle);
	    }

	    if (method & (1<<GZIP)) {
		c = cram_compress_by_method((char *)b->data, b->uncomp_size,
					    &sz_gz_def, GZIP, level,
					    Z_FILTERED);
		if (c && sz_best > sz_gz_def) {
		    sz_best = sz_gz_def;
		    method_best = GZIP;
		    if (c_best)
			free(c_best);
		    c_best = c;
		} else if (c) {
		    free(c);
		} else {
		    sz_gz_def = b->uncomp_size*2+1000;
		}

		//fprintf(stderr, "Block %d; %d->%d\n", b->content_id, b->uncomp_size, sz_gz_def);
	    }

	    if (method & (1<<RANS0)) {
		c = cram_compress_by_method((char *)b->data, b->uncomp_size,
					    &sz_rans0, RANS0, 0, 0);
		if (c && sz_best > sz_rans0) {
		    sz_best = sz_rans0;
		    method_best = RANS0;
		    if (c_best)
			free(c_best);
		    c_best = c;
		} else if (c) {
		    free(c);
		} else {
		    sz_rans0 = b->uncomp_size*2+1000;
		}
	    }

	    if (method & (1<<RANS1)) {
		c = cram_compress_by_method((char *)b->data, b->uncomp_size,
					    &sz_rans1, RANS1, 0, 0);
		if (c && sz_best > sz_rans1) {
		    sz_best = sz_rans1;
		    method_best = RANS1;
		    if (c_best)
			free(c_best);
		    c_best = c;
		} else if (c) {
		    free(c);
		} else {
		    sz_rans1 = b->uncomp_size*2+1000;
		}
	    }

	    if (method & (1<<BZIP2)) {
		c = cram_compress_by_method((char *)b->data, b->uncomp_size,
					    &sz_bzip2, BZIP2, level, 0);
		if (c && sz_best > sz_bzip2) {
		    sz_best = sz_bzip2;
		    method_best = BZIP2;
		    if (c_best)
			free(c_best);
		    c_best = c;
		} else if (c) {
		    free(c);
		} else {
		    sz_bzip2 = b->uncomp_size*2+1000;
		}
	    }

	    if (method & (1<<LZMA)) {
		c = cram_compress_by_method((char *)b->data, b->uncomp_size,
					    &sz_lzma, LZMA, level, 0);
		if (c && sz_best > sz_lzma) {
		    sz_best = sz_lzma;
		    method_best = LZMA;
		    if (c_best)
			free(c_best);
		    c_best = c;
		} else if (c) {
		    free(c);
		} else {
		    sz_lzma = b->uncomp_size*2+1000;
		}
	    }

	    //fprintf(stderr, "sz_best = %d\n", sz_best);

	    free(b->data);
	    b->data = (unsigned char *)c_best;
	    //printf("method_best = %s\n", cram_block_method2str(method_best));
	    b->method = method_best == GZIP_RLE ? GZIP : method_best;
	    b->comp_size = sz_best;

	    pthread_mutex_lock(&fd->metrics_lock);
	    metrics->sz_gz_rle += sz_gz_rle;
	    metrics->sz_gz_def += sz_gz_def;
	    metrics->sz_rans0  += sz_rans0;
	    metrics->sz_rans1  += sz_rans1;
	    metrics->sz_bzip2  += sz_bzip2;
	    metrics->sz_lzma   += sz_lzma;
	    if (--metrics->trial == 0) {
		int best_method = RAW;
		int best_sz = INT_MAX;

		// Scale methods by cost
		if (fd->level <= 3) {
		    metrics->sz_rans1  *= 1.02;
		    metrics->sz_gz_def *= 1.04;
		    metrics->sz_bzip2  *= 1.08;
		    metrics->sz_lzma   *= 1.10;
		} else if (fd->level <= 6) {
		    metrics->sz_rans1  *= 1.01;
		    metrics->sz_gz_def *= 1.02;
		    metrics->sz_bzip2  *= 1.03;
		    metrics->sz_lzma   *= 1.05;
		}

		if (method & (1<<GZIP_RLE) && best_sz > metrics->sz_gz_rle)
		    best_sz = metrics->sz_gz_rle, best_method = GZIP_RLE;

		if (method & (1<<GZIP) && best_sz > metrics->sz_gz_def)
		    best_sz = metrics->sz_gz_def, best_method = GZIP;

		if (method & (1<<RANS0) && best_sz > metrics->sz_rans0)
		    best_sz = metrics->sz_rans0, best_method = RANS0;

		if (method & (1<<RANS1) && best_sz > metrics->sz_rans1)
		    best_sz = metrics->sz_rans1, best_method = RANS1;

		if (method & (1<<BZIP2) && best_sz > metrics->sz_bzip2)
		    best_sz = metrics->sz_bzip2, best_method = BZIP2;

		if (method & (1<<LZMA) && best_sz > metrics->sz_lzma)
		    best_sz = metrics->sz_lzma, best_method = LZMA;

		if (best_method == GZIP_RLE) {
		    metrics->method = GZIP;
		    metrics->strat  = Z_RLE;
		} else {
		    metrics->method = best_method;
		    metrics->strat  = Z_FILTERED;
		}

		// If we see at least MAXFAIL trials in a row for a specific
		// compression method with more than MAXDELTA aggregate
		// size then we drop this from the list of methods used
		// for this block type.
#define MAXDELTA 0.20
#define MAXFAILS 4
		if (best_method == GZIP_RLE) {
		    metrics->gz_rle_cnt = 0;
		    metrics->gz_rle_extra = 0;
		} else if (best_sz < metrics->sz_gz_rle) {
		    double r = (double)metrics->sz_gz_rle / best_sz - 1;
		    if (++metrics->gz_rle_cnt >= MAXFAILS && 
			(metrics->gz_rle_extra += r) >= MAXDELTA)
			method &= ~(1<<GZIP_RLE);
		}

		if (best_method == GZIP) {
		    metrics->gz_def_cnt = 0;
		    metrics->gz_def_extra = 0;
		} else if (best_sz < metrics->sz_gz_def) {
		    double r = (double)metrics->sz_gz_def / best_sz - 1;
		    if (++metrics->gz_def_cnt >= MAXFAILS &&
			(metrics->gz_def_extra += r) >= MAXDELTA)
			method &= ~(1<<GZIP);
		}

		if (best_method == RANS0) {
		    metrics->rans0_cnt = 0;
		    metrics->rans0_extra = 0;
		} else if (best_sz < metrics->sz_rans0) {
		    double r = (double)metrics->sz_rans0 / best_sz - 1;
		    if (++metrics->rans0_cnt >= MAXFAILS &&
			(metrics->rans0_extra += r) >= MAXDELTA)
			method &= ~(1<<RANS0);
		}

		if (best_method == RANS1) {
		    metrics->rans1_cnt = 0;
		    metrics->rans1_extra = 0;
		} else if (best_sz < metrics->sz_rans1) {
		    double r = (double)metrics->sz_rans1 / best_sz - 1;
		    if (++metrics->rans1_cnt >= MAXFAILS &&
			(metrics->rans1_extra += r) >= MAXDELTA)
			method &= ~(1<<RANS1);
		}

		if (best_method == BZIP2) {
		    metrics->bzip2_cnt = 0;
		    metrics->bzip2_extra = 0;
		} else if (best_sz < metrics->sz_bzip2) {
		    double r = (double)metrics->sz_bzip2 / best_sz - 1;
		    if (++metrics->bzip2_cnt >= MAXFAILS &&
			(metrics->bzip2_extra += r) >= MAXDELTA)
			method &= ~(1<<BZIP2);
		}

		if (best_method == LZMA) {
		    metrics->lzma_cnt = 0;
		    metrics->lzma_extra = 0;
		} else if (best_sz < metrics->sz_lzma) {
		    double r = (double)metrics->sz_lzma / best_sz - 1;
		    if (++metrics->lzma_cnt >= MAXFAILS &&
			(metrics->lzma_extra += r) >= MAXDELTA)
			method &= ~(1<<LZMA);
		}

		//if (method != metrics->revised_method)
		//    fprintf(stderr, "%d: method from %x to %x\n",
		//	    b->content_id, metrics->revised_method, method);
		metrics->revised_method = method;
	    }
	    pthread_mutex_unlock(&fd->metrics_lock);
	} else {
	    strat = metrics->strat;
	    method = metrics->method;

	    pthread_mutex_unlock(&fd->metrics_lock);
	    comp = cram_compress_by_method((char *)b->data, b->uncomp_size,
					   &comp_size, method,
					   level, strat);
	    if (!comp)
		return -1;
	    free(b->data);
	    b->data = (unsigned char *)comp;
	    b->comp_size = comp_size;
	    b->method = method;
	}

    } else {
	// no cached metrics, so just do zlib?
	comp = cram_compress_by_method((char *)b->data, b->uncomp_size,
				       &comp_size, GZIP, level, Z_FILTERED);
	if (!comp) {
	    fprintf(stderr, "Compression failed!\n");
	    return -1;
	}
	free(b->data);
	b->data = (unsigned char *)comp;
	b->comp_size = comp_size;
	b->method = GZIP;
    }

    if (fd->verbose)
	fprintf(stderr, "Compressed block ID %d from %d to %d by method %s\n",
		b->content_id, b->uncomp_size, b->comp_size,
		cram_block_method2str(b->method));

    if (b->method == RANS1)
	b->method = RANS0; // Spec just has RANS (not 0/1) with auto-sensing

    return 0;
}